

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void ly_ctx_unset_searchdirs(ly_ctx *ctx)

{
  int local_14;
  int i;
  ly_ctx *ctx_local;
  
  if ((ctx->models).search_paths != (char **)0x0) {
    for (local_14 = 0; (ctx->models).search_paths[local_14] != (char *)0x0; local_14 = local_14 + 1)
    {
      free((ctx->models).search_paths[local_14]);
    }
    free((ctx->models).search_paths);
    (ctx->models).search_paths = (char **)0x0;
  }
  return;
}

Assistant:

API void
ly_ctx_unset_searchdirs(struct ly_ctx *ctx)
{
    int i;

    if (!ctx->models.search_paths) {
        return;
    }

    for (i = 0; ctx->models.search_paths[i]; i++) {
        free(ctx->models.search_paths[i]);
    }
    free(ctx->models.search_paths);
    ctx->models.search_paths = NULL;
}